

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O0

Maybe<kj::Exception> * __thiscall
kj::runCatchingExceptions<kj::Thread::runThread(void*)::__0>
          (Maybe<kj::Exception> *__return_storage_ptr__,kj *this,anon_class_8_1_a8a4b3b1 *func)

{
  anon_class_8_1_a8a4b3b1 *func_local;
  
  Thread::runThread::anon_class_8_1_a8a4b3b1::operator()((anon_class_8_1_a8a4b3b1 *)this);
  Maybe<kj::Exception>::Maybe(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Maybe<Exception> runCatchingExceptions(Func&& func) {
  try {
    func();
    return kj::none;
  } catch (...) {
    return getCaughtExceptionAsKj();
  }
}